

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.c
# Opt level: O2

int json_pointer_set_single_path
              (json_object *parent,char *path,json_object *value,
              json_pointer_array_set_cb array_set_cb,void *priv)

{
  int iVar1;
  int *piVar2;
  size_t idx;
  
  iVar1 = json_object_is_type(parent,json_type_array);
  if (iVar1 == 0) {
    iVar1 = json_object_is_type(parent,json_type_object);
    if (iVar1 != 0) {
      iVar1 = json_object_object_add(parent,path,value);
      return iVar1;
    }
    piVar2 = __errno_location();
    *piVar2 = 2;
  }
  else {
    if ((*path == '-') && (path[1] == '\0')) {
      iVar1 = json_object_array_add(parent,value);
      return iVar1;
    }
    iVar1 = is_valid_index(path,&idx);
    if (iVar1 != 0) {
      iVar1 = (*array_set_cb)(parent,idx,value,priv);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

static int json_pointer_set_single_path(struct json_object *parent, const char *path,
                                        struct json_object *value,
					json_pointer_array_set_cb array_set_cb, void *priv)
{
	if (json_object_is_type(parent, json_type_array))
	{
		size_t idx;
		/* RFC (Chapter 4) states that '-' may be used to add new elements to an array */
		if (path[0] == '-' && path[1] == '\0')
			return json_object_array_add(parent, value);
		if (!is_valid_index(path, &idx))
			return -1;
		return array_set_cb(parent, idx, value, priv);
	}

	/* path replacements should have been done in json_pointer_get_single_path(),
	 * and we should still be good here
	 */
	if (json_object_is_type(parent, json_type_object))
		return json_object_object_add(parent, path, value);

	/* Getting here means that we tried to "dereference" a primitive JSON type
	 * (like string, int, bool).i.e. add a sub-object to it
	 */
	errno = ENOENT;
	return -1;
}